

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListCommand.cxx
# Opt level: O3

bool anon_unknown.dwarf_b8a4c2::HandleRemoveAtCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  size_type sVar1;
  pointer puVar2;
  pointer puVar3;
  bool bVar4;
  pointer pbVar5;
  size_type *psVar6;
  ulong uVar7;
  size_type sVar8;
  long lVar9;
  uint val;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  ulong uVar12;
  string *var;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view separator;
  string_view value_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> removed;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  varArgsExpanded;
  string value;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_298;
  int local_27c;
  undefined1 local_278 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_248;
  undefined1 local_228 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  undefined8 local_1e8;
  char *local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_1d0;
  undefined8 local_1c8;
  char *local_1c0;
  size_t local_1b8;
  char *pcStack_1b0;
  undefined8 local_1a8;
  char *local_1a0;
  ios_base local_198 [264];
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) < 0x41) {
    local_208._M_allocated_capacity = (size_type)&local_1f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_208,"sub-command REMOVE_AT requires at least two arguments.","");
    std::__cxx11::string::_M_assign((string *)&status->Error);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._M_allocated_capacity != &local_1f8) {
      operator_delete((void *)local_208._M_allocated_capacity,local_1f8._M_allocated_capacity + 1);
    }
    bVar4 = false;
  }
  else {
    var = pbVar5 + 1;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_248.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar4 = GetList(&local_248,var,status->Makefile);
    if ((bVar4) &&
       (local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_248.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (unsigned_long *)0x0;
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x40 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5)) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)((long)local_248.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_248.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar12 = 2;
        lVar9 = 0x40;
        do {
          bVar4 = GetIndexArg((string *)((long)&(pbVar5->_M_dataplus)._M_p + lVar9),&local_27c,
                              status->Makefile);
          if (!bVar4) {
            pbVar5 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            local_1f8._8_8_ = *(undefined8 *)((long)&(pbVar5->_M_dataplus)._M_p + lVar9);
            local_1f8._M_allocated_capacity =
                 *(size_type *)((long)&pbVar5->_M_string_length + lVar9);
            local_208._M_allocated_capacity = 7;
            local_208._8_8_ = (long)", index: " + 2;
            local_1e8 = 0x15;
            local_1e0 = " is not a valid index";
            views._M_len = 3;
            views._M_array = (iterator)&local_208;
            cmCatViews_abi_cxx11_((string *)local_278,views);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            local_228._0_8_ = local_278._0_8_;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_
                != &local_268) {
LAB_002ae593:
              operator_delete((void *)local_228._0_8_,(ulong)(local_268._M_dataplus._M_p + 1));
            }
LAB_002ae59b:
            bVar4 = false;
            goto LAB_002ae59d;
          }
          val = (local_27c >> 0x1f & (uint)paVar11) + local_27c;
          paVar10 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(ulong)val;
          if (((int)val < 0) || (paVar11 <= paVar10)) {
            cmAlphaNum::cmAlphaNum(&local_90,val);
            local_208._M_allocated_capacity = 7;
            local_208._8_8_ = (long)", index: " + 2;
            local_1f8._M_allocated_capacity = local_90.View_._M_len;
            local_1f8._8_8_ = local_90.View_._M_str;
            local_1e8 = 0x10;
            local_1e0 = " out of range (-";
            cmAlphaNum::cmAlphaNum((cmAlphaNum *)local_278,(unsigned_long)paVar11);
            local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_278._0_8_;
            pbStack_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_278._8_8_;
            local_1c8 = 2;
            local_1c0 = ", ";
            cmAlphaNum::cmAlphaNum(&local_60,(long)paVar11 - 1);
            local_1b8 = local_60.View_._M_len;
            pcStack_1b0 = local_60.View_._M_str;
            local_1a8 = 1;
            local_1a0 = ")";
            views_00._M_len = 7;
            views_00._M_array = (iterator)&local_208;
            cmCatViews_abi_cxx11_((string *)local_228,views_00);
            std::__cxx11::string::_M_assign((string *)&status->Error);
            local_268._M_dataplus._M_p = (pointer)local_228._16_8_;
            if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_228._0_8_
                != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_228 + 0x10)) goto LAB_002ae593;
            goto LAB_002ae59b;
          }
          local_208._M_allocated_capacity = (size_type)paVar10;
          if (local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
            _M_realloc_insert<unsigned_long>
                      (&local_298,
                       (iterator)
                       local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_208._M_allocated_capacity);
          }
          else {
            *local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish = (unsigned_long)paVar10;
            local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish + 1;
          }
          puVar3 = local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          puVar2 = local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar12 = uVar12 + 1;
          pbVar5 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar9 = lVar9 + 0x20;
        } while (uVar12 < (ulong)((long)(args->
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5
                                 >> 5));
        if (local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start !=
            local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          uVar12 = (long)local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 3;
          lVar9 = 0x3f;
          if (uVar12 != 0) {
            for (; uVar12 >> lVar9 == 0; lVar9 = lVar9 + -1) {
            }
          }
          std::
          __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_start,
                     local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
          std::
          __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (puVar2,puVar3);
        }
      }
      local_208._8_8_ =
           local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start + 1);
        do {
          paVar10 = paVar11;
          if (paVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish) goto LAB_002ae38f;
          paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar10->_M_allocated_capacity + 1);
        } while ((&paVar10->_M_allocated_capacity)[-1] != paVar10->_M_allocated_capacity);
        psVar6 = &paVar10->_M_allocated_capacity + -1;
        sVar8 = (&paVar10->_M_allocated_capacity)[-1];
        for (; paVar11 !=
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
            paVar11 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)(&paVar11->_M_allocated_capacity + 1)) {
          sVar1 = paVar11->_M_allocated_capacity;
          if (sVar8 != sVar1) {
            psVar6[1] = sVar1;
            psVar6 = psVar6 + 1;
          }
          sVar8 = sVar1;
        }
        local_208._8_8_ = psVar6 + 1;
      }
LAB_002ae38f:
      local_208._M_allocated_capacity =
           (size_type)
           local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_278._8_8_ =
           cmRemoveIndices<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,cmRange<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>>
                     (&local_248,
                      (cmRange<__gnu_cxx::__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       *)&local_208);
      local_278._0_8_ =
           local_248.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      separator._M_str = ";";
      separator._M_len = 1;
      cmJoin((string *)&local_208,(cmStringRange *)local_278,separator,(string_view)ZEXT816(0));
      value_00._M_str = (char *)local_208._M_allocated_capacity;
      value_00._M_len = local_208._8_8_;
      cmMakefile::AddDefinition(status->Makefile,var,value_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_allocated_capacity != &local_1f8) {
        operator_delete((void *)local_208._M_allocated_capacity,local_1f8._M_allocated_capacity + 1)
        ;
      }
      bVar4 = true;
LAB_002ae59d:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
        operator_delete(local_298.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_298.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208._M_local_buf);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,"index: ",7);
      pbVar5 = (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      if (0x20 < (ulong)((long)(args->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5)) {
        uVar12 = 1;
        lVar9 = 0x28;
        do {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,*(char **)((long)pbVar5 + lVar9 + -8),
                     *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar9));
          pbVar5 = (args->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          uVar7 = (long)(args->
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5;
          if (uVar12 != uVar7 - 1) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,", ",2);
            pbVar5 = (args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            uVar7 = (long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5;
          }
          uVar12 = uVar12 + 1;
          lVar9 = lVar9 + 0x20;
        } while (uVar12 < uVar7);
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&local_208," out of range (0, 0)",0x14);
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::_M_assign((string *)&status->Error);
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_278._0_8_ !=
          &local_268) {
        operator_delete((void *)local_278._0_8_,(ulong)(local_268._M_dataplus._M_p + 1));
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208._M_local_buf);
      std::ios_base::~ios_base(local_198);
      bVar4 = false;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_248);
  }
  return bVar4;
}

Assistant:

bool HandleRemoveAtCommand(std::vector<std::string> const& args,
                           cmExecutionStatus& status)
{
  if (args.size() < 3) {
    status.SetError("sub-command REMOVE_AT requires at least "
                    "two arguments.");
    return false;
  }

  const std::string& listName = args[1];
  // expand the variable
  std::vector<std::string> varArgsExpanded;
  if (!GetList(varArgsExpanded, listName, status.GetMakefile()) ||
      varArgsExpanded.empty()) {
    std::ostringstream str;
    str << "index: ";
    for (size_t i = 1; i < args.size(); ++i) {
      str << args[i];
      if (i != args.size() - 1) {
        str << ", ";
      }
    }
    str << " out of range (0, 0)";
    status.SetError(str.str());
    return false;
  }

  size_t cc;
  std::vector<size_t> removed;
  size_t nitem = varArgsExpanded.size();
  for (cc = 2; cc < args.size(); ++cc) {
    int item;
    if (!GetIndexArg(args[cc], &item, status.GetMakefile())) {
      status.SetError(cmStrCat("index: ", args[cc], " is not a valid index"));
      return false;
    }
    if (item < 0) {
      item = static_cast<int>(nitem) + item;
    }
    if (item < 0 || nitem <= static_cast<size_t>(item)) {
      status.SetError(cmStrCat("index: ", item, " out of range (-", nitem,
                               ", ", nitem - 1, ")"));
      return false;
    }
    removed.push_back(static_cast<size_t>(item));
  }

  std::sort(removed.begin(), removed.end());
  auto remEnd = std::unique(removed.begin(), removed.end());
  auto remBegin = removed.begin();

  auto argsEnd =
    cmRemoveIndices(varArgsExpanded, cmMakeRange(remBegin, remEnd));
  auto argsBegin = varArgsExpanded.cbegin();
  std::string value = cmJoin(cmMakeRange(argsBegin, argsEnd), ";");

  status.GetMakefile().AddDefinition(listName, value);
  return true;
}